

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfdcapi_transaction.cpp
# Opt level: O3

void __thiscall
cfdcapi_transaction_SplitTxOut_Test::TestBody(cfdcapi_transaction_SplitTxOut_Test *this)

{
  bool bVar1;
  char *pcVar2;
  char *in_R9;
  AssertionResult gtest_ar_;
  char *tx_hex;
  void *split_handle;
  int ret;
  AssertionResult gtest_ar;
  void *tx_handle;
  void *handle;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_78;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_70;
  AssertHelper local_68;
  AssertHelper local_60;
  int local_54;
  AssertHelper local_50;
  string local_48;
  AssertHelper local_28;
  void *local_20;
  AssertHelper local_18;
  
  local_20 = (void *)0x0;
  local_54 = CfdCreateHandle(&local_20);
  local_78.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       ((ulong)local_78.ptr_._4_4_ << 0x20);
  testing::internal::CmpHelperEQ<CfdErrorCode,int>
            ((internal *)&local_48,"kCfdSuccess","ret",(CfdErrorCode *)&local_78,&local_54);
  if ((char)local_48._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_78);
    if ((undefined8 *)local_48._M_string_length == (undefined8 *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)local_48._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_28,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_transaction.cpp"
               ,0x366,pcVar2);
    testing::internal::AssertHelper::operator=(&local_28,(Message *)&local_78);
    testing::internal::AssertHelper::~AssertHelper(&local_28);
    if (local_78.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_78.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_78.ptr_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_48._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_78.ptr_._0_1_ = local_20 != (void *)0x0;
  local_70.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_20 == (void *)0x0) {
    testing::Message::Message((Message *)&local_28);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_48,(internal *)&local_78,(AssertionResult *)"(nullptr == handle)","true",
               "false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_60,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_transaction.cpp"
               ,0x367,(char *)CONCAT71(local_48._M_dataplus._M_p._1_7_,
                                       (char)local_48._M_dataplus._M_p));
    testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_28);
    testing::internal::AssertHelper::~AssertHelper(&local_60);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_48._M_dataplus._M_p._1_7_,(char)local_48._M_dataplus._M_p) !=
        &local_48.field_2) {
      operator_delete((undefined1 *)
                      CONCAT71(local_48._M_dataplus._M_p._1_7_,(char)local_48._M_dataplus._M_p));
    }
    if (local_28.data_ != (AssertHelperData *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && (local_28.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_28.data_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_70,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_28.data_ = (AssertHelperData *)0x0;
  local_54 = CfdInitializeTxDataHandle
                       (local_20,0,
                        "02000000000102a38845c1a19b389f27217b91e2120273b447db3e595bba628f0be833f301a24a000000006a47304402205d038d82d3d7043f21b9b3d0e3ea85225ffcb78d02b8531cb1ddbec7e577e7460220367c0b985b1bb76de1f95ce4696ad9717f28ed6a356765cf31a894c42f3bb81201210359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567bffffffffe3b9639791a30193e253c431ed93e3ca8a77334da50cccb252fd19b692915531000000001716001445663e592ff613587f0fdd6e74034c5239710dcaffffffff02706f9800000000001976a9149157a10c10924d7550ee7079cda55db1d11a278a88ac20bf02000000000016001445663e592ff613587f0fdd6e74034c5239710dca00024730440220572c4f56643d35a229bf632810ee947190414285b790e841f9e664dfd8e1f25d022021d8e4b01c08ad50bf3f1b6edfb25bb9dc8640b36dce1e26bff352097068d07f01210206d4fabad19c61ffb180fa8a6d0f973e11485e60115557179786f7ea5d806a2700000000"
                        ,&local_28.data_);
  local_78.ptr_ = local_78.ptr_ & 0xffffffff00000000;
  testing::internal::CmpHelperEQ<CfdErrorCode,int>
            ((internal *)&local_48,"kCfdSuccess","ret",(CfdErrorCode *)&local_78,&local_54);
  if ((char)local_48._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_78);
    if ((undefined8 *)local_48._M_string_length == (undefined8 *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)local_48._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_60,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_transaction.cpp"
               ,0x36c,pcVar2);
    testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_78);
    testing::internal::AssertHelper::~AssertHelper(&local_60);
    if (local_78.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_78.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_78.ptr_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_48._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_78.ptr_._0_1_ = local_28.data_ != (AssertHelperData *)0x0;
  local_70.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_28.data_ == (AssertHelperData *)0x0) {
    testing::Message::Message((Message *)&local_60);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_48,(internal *)&local_78,(AssertionResult *)"(nullptr == tx_handle)","true",
               "false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_68,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_transaction.cpp"
               ,0x36d,(char *)CONCAT71(local_48._M_dataplus._M_p._1_7_,
                                       (char)local_48._M_dataplus._M_p));
    testing::internal::AssertHelper::operator=(&local_68,(Message *)&local_60);
    testing::internal::AssertHelper::~AssertHelper(&local_68);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_48._M_dataplus._M_p._1_7_,(char)local_48._M_dataplus._M_p) !=
        &local_48.field_2) {
      operator_delete((undefined1 *)
                      CONCAT71(local_48._M_dataplus._M_p._1_7_,(char)local_48._M_dataplus._M_p));
    }
    if (local_60.data_ != (AssertHelperData *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && (local_60.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_60.data_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_70,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  if (local_54 == 0) {
    local_60.data_ = (AssertHelperData *)0x0;
    local_54 = CfdCreateSplitTxOutHandle(local_20,local_28.data_,&local_60.data_);
    local_78.ptr_ = local_78.ptr_ & 0xffffffff00000000;
    testing::internal::CmpHelperEQ<CfdErrorCode,int>
              ((internal *)&local_48,"kCfdSuccess","ret",(CfdErrorCode *)&local_78,&local_54);
    if ((char)local_48._M_dataplus._M_p == '\0') {
      testing::Message::Message((Message *)&local_78);
      if ((undefined8 *)local_48._M_string_length == (undefined8 *)0x0) {
        pcVar2 = "";
      }
      else {
        pcVar2 = *(char **)local_48._M_string_length;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_68,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_transaction.cpp"
                 ,0x371,pcVar2);
      testing::internal::AssertHelper::operator=(&local_68,(Message *)&local_78);
      testing::internal::AssertHelper::~AssertHelper(&local_68);
      if (local_78.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        bVar1 = testing::internal::IsTrue(true);
        if ((bVar1) &&
           (local_78.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
          (**(code **)(*(long *)local_78.ptr_ + 8))();
        }
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&local_48._M_string_length,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    local_78.ptr_._0_1_ = local_60.data_ != (AssertHelperData *)0x0;
    local_70.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (local_60.data_ == (AssertHelperData *)0x0) {
      testing::Message::Message((Message *)&local_68);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_48,(internal *)&local_78,(AssertionResult *)"(nullptr == split_handle)",
                 "true","false",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_50,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_transaction.cpp"
                 ,0x372,(char *)CONCAT71(local_48._M_dataplus._M_p._1_7_,
                                         (char)local_48._M_dataplus._M_p));
      testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_68);
      testing::internal::AssertHelper::~AssertHelper(&local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT71(local_48._M_dataplus._M_p._1_7_,(char)local_48._M_dataplus._M_p) !=
          &local_48.field_2) {
        operator_delete((undefined1 *)
                        CONCAT71(local_48._M_dataplus._M_p._1_7_,(char)local_48._M_dataplus._M_p));
      }
      if (local_68.data_ != (AssertHelperData *)0x0) {
        bVar1 = testing::internal::IsTrue(true);
        if ((bVar1) && (local_68.data_ != (AssertHelperData *)0x0)) {
          (**(code **)(*(long *)local_68.data_ + 8))();
        }
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_70,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    if (local_54 == 0) {
      pcVar2 = "";
      local_54 = CfdAddSplitTxOutData
                           (local_20,local_60.data_,80000,
                            "bc1qvjtfmrxu524qhdevl6yyyasjs7xmnzjlqlu60mrwepact60eyz9s9xjw0c","","");
      local_78.ptr_ = local_78.ptr_ & 0xffffffff00000000;
      testing::internal::CmpHelperEQ<CfdErrorCode,int>
                ((internal *)&local_48,"kCfdSuccess","ret",(CfdErrorCode *)&local_78,&local_54);
      if ((char)local_48._M_dataplus._M_p == '\0') {
        testing::Message::Message((Message *)&local_78);
        if ((undefined8 *)local_48._M_string_length != (undefined8 *)0x0) {
          pcVar2 = *(char **)local_48._M_string_length;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_68,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_transaction.cpp"
                   ,0x376,pcVar2);
        testing::internal::AssertHelper::operator=(&local_68,(Message *)&local_78);
        testing::internal::AssertHelper::~AssertHelper(&local_68);
        if (local_78.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          bVar1 = testing::internal::IsTrue(true);
          if ((bVar1) &&
             (local_78.ptr_ !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
            (**(code **)(*(long *)local_78.ptr_ + 8))();
          }
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&local_48._M_string_length,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      pcVar2 = "";
      in_R9 = "";
      local_54 = CfdAddSplitTxOutData
                           (local_20,local_60.data_,50000,
                            "bc1qu2dh70j584vpexwf9dvag5sckqytstpdgp4m50rnsn2ju45pyj4qudazmh","","");
      local_78.ptr_ = local_78.ptr_ & 0xffffffff00000000;
      testing::internal::CmpHelperEQ<CfdErrorCode,int>
                ((internal *)&local_48,"kCfdSuccess","ret",(CfdErrorCode *)&local_78,&local_54);
      if ((char)local_48._M_dataplus._M_p == '\0') {
        testing::Message::Message((Message *)&local_78);
        if ((undefined8 *)local_48._M_string_length != (undefined8 *)0x0) {
          pcVar2 = *(char **)local_48._M_string_length;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_68,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_transaction.cpp"
                   ,0x379,pcVar2);
        testing::internal::AssertHelper::operator=(&local_68,(Message *)&local_78);
        testing::internal::AssertHelper::~AssertHelper(&local_68);
        if (local_78.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          bVar1 = testing::internal::IsTrue(true);
          if ((bVar1) &&
             (local_78.ptr_ !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
            (**(code **)(*(long *)local_78.ptr_ + 8))();
          }
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&local_48._M_string_length,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      local_54 = CfdSplitTxOut(local_20,local_28.data_,local_60.data_,1);
      local_78.ptr_ = local_78.ptr_ & 0xffffffff00000000;
      testing::internal::CmpHelperEQ<CfdErrorCode,int>
                ((internal *)&local_48,"kCfdSuccess","ret",(CfdErrorCode *)&local_78,&local_54);
      if ((char)local_48._M_dataplus._M_p == '\0') {
        testing::Message::Message((Message *)&local_78);
        if ((undefined8 *)local_48._M_string_length == (undefined8 *)0x0) {
          pcVar2 = "";
        }
        else {
          pcVar2 = *(char **)local_48._M_string_length;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_68,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_transaction.cpp"
                   ,0x37c,pcVar2);
        testing::internal::AssertHelper::operator=(&local_68,(Message *)&local_78);
        testing::internal::AssertHelper::~AssertHelper(&local_68);
        if (local_78.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          bVar1 = testing::internal::IsTrue(true);
          if ((bVar1) &&
             (local_78.ptr_ !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
            (**(code **)(*(long *)local_78.ptr_ + 8))();
          }
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&local_48._M_string_length,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      local_54 = CfdFreeSplitTxOutHandle(local_20,local_60.data_);
      local_78.ptr_ = local_78.ptr_ & 0xffffffff00000000;
      testing::internal::CmpHelperEQ<CfdErrorCode,int>
                ((internal *)&local_48,"kCfdSuccess","ret",(CfdErrorCode *)&local_78,&local_54);
      if ((char)local_48._M_dataplus._M_p == '\0') {
        testing::Message::Message((Message *)&local_78);
        if ((undefined8 *)local_48._M_string_length == (undefined8 *)0x0) {
          pcVar2 = "";
        }
        else {
          pcVar2 = *(char **)local_48._M_string_length;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_68,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_transaction.cpp"
                   ,0x37f,pcVar2);
        testing::internal::AssertHelper::operator=(&local_68,(Message *)&local_78);
        testing::internal::AssertHelper::~AssertHelper(&local_68);
        if (local_78.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          bVar1 = testing::internal::IsTrue(true);
          if ((bVar1) &&
             (local_78.ptr_ !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
            (**(code **)(*(long *)local_78.ptr_ + 8))();
          }
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&local_48._M_string_length,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    }
    local_68.data_ = (AssertHelperData *)0x0;
    local_54 = CfdFinalizeTransaction(local_20,local_28.data_,(char **)&local_68);
    local_78.ptr_ = local_78.ptr_ & 0xffffffff00000000;
    testing::internal::CmpHelperEQ<CfdErrorCode,int>
              ((internal *)&local_48,"kCfdSuccess","ret",(CfdErrorCode *)&local_78,&local_54);
    if ((char)local_48._M_dataplus._M_p == '\0') {
      testing::Message::Message((Message *)&local_78);
      if ((undefined8 *)local_48._M_string_length == (undefined8 *)0x0) {
        pcVar2 = "";
      }
      else {
        pcVar2 = *(char **)local_48._M_string_length;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_50,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_transaction.cpp"
                 ,900,pcVar2);
      testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_78);
      testing::internal::AssertHelper::~AssertHelper(&local_50);
      if (local_78.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        bVar1 = testing::internal::IsTrue(true);
        if ((bVar1) &&
           (local_78.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
          (**(code **)(*(long *)local_78.ptr_ + 8))();
        }
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&local_48._M_string_length,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    local_78.ptr_._0_1_ = local_68.data_ != (AssertHelperData *)0x0;
    local_70.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (local_68.data_ == (AssertHelperData *)0x0) {
      testing::Message::Message((Message *)&local_50);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_48,(internal *)&local_78,(AssertionResult *)"(nullptr == tx_hex)","true",
                 "false",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_18,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_transaction.cpp"
                 ,0x385,(char *)CONCAT71(local_48._M_dataplus._M_p._1_7_,
                                         (char)local_48._M_dataplus._M_p));
      testing::internal::AssertHelper::operator=(&local_18,(Message *)&local_50);
      testing::internal::AssertHelper::~AssertHelper(&local_18);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT71(local_48._M_dataplus._M_p._1_7_,(char)local_48._M_dataplus._M_p) !=
          &local_48.field_2) {
        operator_delete((undefined1 *)
                        CONCAT71(local_48._M_dataplus._M_p._1_7_,(char)local_48._M_dataplus._M_p));
      }
      if (local_50.data_ != (AssertHelperData *)0x0) {
        bVar1 = testing::internal::IsTrue(true);
        if ((bVar1) && (local_50.data_ != (AssertHelperData *)0x0)) {
          (**(code **)(*(long *)local_50.data_ + 8))();
        }
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_70,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    if (local_68.data_ != (AssertHelperData *)0x0) {
      testing::internal::CmpHelperSTREQ
                ((internal *)&local_48,
                 "\"02000000000102a38845c1a19b389f27217b91e2120273b447db3e595bba628f0be833f301a24a000000006a47304402205d038d82d3d7043f21b9b3d0e3ea85225ffcb78d02b8531cb1ddbec7e577e7460220367c0b985b1bb76de1f95ce4696ad9717f28ed6a356765cf31a894c42f3bb81201210359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567bffffffffe3b9639791a30193e253c431ed93e3ca8a77334da50cccb252fd19b692915531000000001716001445663e592ff613587f0fdd6e74034c5239710dcaffffffff04706f9800000000001976a9149157a10c10924d7550ee7079cda55db1d11a278a88ac50c300000000000016001445663e592ff613587f0fdd6e74034c5239710dca803801000000000022002064969d8cdca2aa0bb72cfe88427612878db98a5f07f9a7ec6ec87b85e9f9208b50c3000000000000220020e29b7f3e543d581c99c92b59d45218b008b82c2d406bba3c7384d52e568124aa00024730440220572c4f56643d35a229bf632810ee947190414285b790e841f9e664dfd8e1f25d022021d8e4b01c08ad50bf3f1b6edfb25bb9dc8640b36dce1e26bff352097068d07f01210206d4fabad19c61ffb180fa8a6d0f973e11485e60115557179786f7ea5d806a2700000000\""
                 ,"tx_hex",
                 "02000000000102a38845c1a19b389f27217b91e2120273b447db3e595bba628f0be833f301a24a000000006a47304402205d038d82d3d7043f21b9b3d0e3ea85225ffcb78d02b8531cb1ddbec7e577e7460220367c0b985b1bb76de1f95ce4696ad9717f28ed6a356765cf31a894c42f3bb81201210359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567bffffffffe3b9639791a30193e253c431ed93e3ca8a77334da50cccb252fd19b692915531000000001716001445663e592ff613587f0fdd6e74034c5239710dcaffffffff04706f9800000000001976a9149157a10c10924d7550ee7079cda55db1d11a278a88ac50c300000000000016001445663e592ff613587f0fdd6e74034c5239710dca803801000000000022002064969d8cdca2aa0bb72cfe88427612878db98a5f07f9a7ec6ec87b85e9f9208b50c3000000000000220020e29b7f3e543d581c99c92b59d45218b008b82c2d406bba3c7384d52e568124aa00024730440220572c4f56643d35a229bf632810ee947190414285b790e841f9e664dfd8e1f25d022021d8e4b01c08ad50bf3f1b6edfb25bb9dc8640b36dce1e26bff352097068d07f01210206d4fabad19c61ffb180fa8a6d0f973e11485e60115557179786f7ea5d806a2700000000"
                 ,(char *)local_68.data_);
      if ((char)local_48._M_dataplus._M_p == '\0') {
        testing::Message::Message((Message *)&local_78);
        if ((undefined8 *)local_48._M_string_length == (undefined8 *)0x0) {
          pcVar2 = "";
        }
        else {
          pcVar2 = *(char **)local_48._M_string_length;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_50,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_transaction.cpp"
                   ,0x387,pcVar2);
        testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_78);
        testing::internal::AssertHelper::~AssertHelper(&local_50);
        if (local_78.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          bVar1 = testing::internal::IsTrue(true);
          if ((bVar1) &&
             (local_78.ptr_ !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
            (**(code **)(*(long *)local_78.ptr_ + 8))();
          }
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&local_48._M_string_length,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      CfdFreeStringBuffer((char *)local_68.data_);
    }
    local_54 = CfdFreeTxDataHandle(local_20,local_28.data_);
    local_78.ptr_ = local_78.ptr_ & 0xffffffff00000000;
    testing::internal::CmpHelperEQ<CfdErrorCode,int>
              ((internal *)&local_48,"kCfdSuccess","ret",(CfdErrorCode *)&local_78,&local_54);
    if ((char)local_48._M_dataplus._M_p == '\0') {
      testing::Message::Message((Message *)&local_78);
      if ((undefined8 *)local_48._M_string_length == (undefined8 *)0x0) {
        pcVar2 = "";
      }
      else {
        pcVar2 = *(char **)local_48._M_string_length;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_50,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_transaction.cpp"
                 ,0x38c,pcVar2);
      testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_78);
      testing::internal::AssertHelper::~AssertHelper(&local_50);
      if (local_78.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        bVar1 = testing::internal::IsTrue(true);
        if ((bVar1) &&
           (local_78.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
          (**(code **)(*(long *)local_78.ptr_ + 8))();
        }
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&local_48._M_string_length,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  }
  local_54 = CfdGetLastErrorCode(local_20);
  if (local_54 != 0) {
    local_78.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    local_54 = CfdGetLastErrorMessage(local_20,(char **)&local_78);
    local_60.data_ = local_60.data_ & 0xffffffff00000000;
    testing::internal::CmpHelperEQ<CfdErrorCode,int>
              ((internal *)&local_48,"kCfdSuccess","ret",(CfdErrorCode *)&local_60,&local_54);
    if ((char)local_48._M_dataplus._M_p == '\0') {
      testing::Message::Message((Message *)&local_60);
      if ((undefined8 *)local_48._M_string_length == (undefined8 *)0x0) {
        pcVar2 = "";
      }
      else {
        pcVar2 = *(char **)local_48._M_string_length;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_68,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_transaction.cpp"
                 ,0x393,pcVar2);
      testing::internal::AssertHelper::operator=(&local_68,(Message *)&local_60);
      testing::internal::AssertHelper::~AssertHelper(&local_68);
      if (local_60.data_ != (AssertHelperData *)0x0) {
        bVar1 = testing::internal::IsTrue(true);
        if ((bVar1) && (local_60.data_ != (AssertHelperData *)0x0)) {
          (**(code **)(*(long *)local_60.data_ + 8))();
        }
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&local_48._M_string_length,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    pcVar2 = "";
    testing::internal::CmpHelperSTREQ
              ((internal *)&local_48,"\"\"","str_buffer","",(char *)local_78.ptr_);
    if ((char)local_48._M_dataplus._M_p == '\0') {
      testing::Message::Message((Message *)&local_60);
      if ((undefined8 *)local_48._M_string_length != (undefined8 *)0x0) {
        pcVar2 = *(char **)local_48._M_string_length;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_68,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_transaction.cpp"
                 ,0x394,pcVar2);
      testing::internal::AssertHelper::operator=(&local_68,(Message *)&local_60);
      testing::internal::AssertHelper::~AssertHelper(&local_68);
      if (local_60.data_ != (AssertHelperData *)0x0) {
        bVar1 = testing::internal::IsTrue(true);
        if ((bVar1) && (local_60.data_ != (AssertHelperData *)0x0)) {
          (**(code **)(*(long *)local_60.data_ + 8))();
        }
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&local_48._M_string_length,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    CfdFreeStringBuffer((char *)local_78.ptr_);
  }
  local_54 = CfdFreeHandle(local_20);
  local_78.ptr_ = local_78.ptr_ & 0xffffffff00000000;
  testing::internal::CmpHelperEQ<CfdErrorCode,int>
            ((internal *)&local_48,"kCfdSuccess","ret",(CfdErrorCode *)&local_78,&local_54);
  if ((char)local_48._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_78);
    if ((undefined8 *)local_48._M_string_length == (undefined8 *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)local_48._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_60,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_transaction.cpp"
               ,0x39a,pcVar2);
    testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_78);
    testing::internal::AssertHelper::~AssertHelper(&local_60);
    if (local_78.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_78.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_78.ptr_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_48._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  return;
}

Assistant:

TEST(cfdcapi_transaction, SplitTxOut) {
  static const char* const kTxHex = "02000000000102a38845c1a19b389f27217b91e2120273b447db3e595bba628f0be833f301a24a000000006a47304402205d038d82d3d7043f21b9b3d0e3ea85225ffcb78d02b8531cb1ddbec7e577e7460220367c0b985b1bb76de1f95ce4696ad9717f28ed6a356765cf31a894c42f3bb81201210359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567bffffffffe3b9639791a30193e253c431ed93e3ca8a77334da50cccb252fd19b692915531000000001716001445663e592ff613587f0fdd6e74034c5239710dcaffffffff02706f9800000000001976a9149157a10c10924d7550ee7079cda55db1d11a278a88ac20bf02000000000016001445663e592ff613587f0fdd6e74034c5239710dca00024730440220572c4f56643d35a229bf632810ee947190414285b790e841f9e664dfd8e1f25d022021d8e4b01c08ad50bf3f1b6edfb25bb9dc8640b36dce1e26bff352097068d07f01210206d4fabad19c61ffb180fa8a6d0f973e11485e60115557179786f7ea5d806a2700000000";

  void* handle = nullptr;
  int ret = CfdCreateHandle(&handle);
  EXPECT_EQ(kCfdSuccess, ret);
  EXPECT_FALSE((nullptr == handle));

  void* tx_handle = nullptr;
  ret = CfdInitializeTxDataHandle(
      handle, kCfdNetworkMainnet, kTxHex, &tx_handle);
  EXPECT_EQ(kCfdSuccess, ret);
  EXPECT_FALSE((nullptr == tx_handle));
  if (ret == kCfdSuccess) {
    void* split_handle = nullptr;
    ret = CfdCreateSplitTxOutHandle(handle, tx_handle, &split_handle);
    EXPECT_EQ(kCfdSuccess, ret);
    EXPECT_FALSE((nullptr == split_handle));
    if (ret == kCfdSuccess) {
      // 180000 -> 80000, 50000, 50000
      ret = CfdAddSplitTxOutData(handle, split_handle, 80000, "bc1qvjtfmrxu524qhdevl6yyyasjs7xmnzjlqlu60mrwepact60eyz9s9xjw0c", "", "");
      EXPECT_EQ(kCfdSuccess, ret);

      ret = CfdAddSplitTxOutData(handle, split_handle, 50000, "bc1qu2dh70j584vpexwf9dvag5sckqytstpdgp4m50rnsn2ju45pyj4qudazmh", "", "");
      EXPECT_EQ(kCfdSuccess, ret);

      ret = CfdSplitTxOut(handle, tx_handle, split_handle, 1);
      EXPECT_EQ(kCfdSuccess, ret);

      ret = CfdFreeSplitTxOutHandle(handle, split_handle);
      EXPECT_EQ(kCfdSuccess, ret);
    }

    char* tx_hex = nullptr;
    ret = CfdFinalizeTransaction(handle, tx_handle, &tx_hex);
    EXPECT_EQ(kCfdSuccess, ret);
    EXPECT_FALSE((nullptr == tx_hex));
    if (tx_hex != nullptr) {
      EXPECT_STREQ("02000000000102a38845c1a19b389f27217b91e2120273b447db3e595bba628f0be833f301a24a000000006a47304402205d038d82d3d7043f21b9b3d0e3ea85225ffcb78d02b8531cb1ddbec7e577e7460220367c0b985b1bb76de1f95ce4696ad9717f28ed6a356765cf31a894c42f3bb81201210359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567bffffffffe3b9639791a30193e253c431ed93e3ca8a77334da50cccb252fd19b692915531000000001716001445663e592ff613587f0fdd6e74034c5239710dcaffffffff04706f9800000000001976a9149157a10c10924d7550ee7079cda55db1d11a278a88ac50c300000000000016001445663e592ff613587f0fdd6e74034c5239710dca803801000000000022002064969d8cdca2aa0bb72cfe88427612878db98a5f07f9a7ec6ec87b85e9f9208b50c3000000000000220020e29b7f3e543d581c99c92b59d45218b008b82c2d406bba3c7384d52e568124aa00024730440220572c4f56643d35a229bf632810ee947190414285b790e841f9e664dfd8e1f25d022021d8e4b01c08ad50bf3f1b6edfb25bb9dc8640b36dce1e26bff352097068d07f01210206d4fabad19c61ffb180fa8a6d0f973e11485e60115557179786f7ea5d806a2700000000", tx_hex);
      CfdFreeStringBuffer(tx_hex);
    }

    ret = CfdFreeTxDataHandle(handle, tx_handle);
    EXPECT_EQ(kCfdSuccess, ret);
  }

  ret = CfdGetLastErrorCode(handle);
  if (ret != kCfdSuccess) {
    char* str_buffer = nullptr;
    ret = CfdGetLastErrorMessage(handle, &str_buffer);
    EXPECT_EQ(kCfdSuccess, ret);
    EXPECT_STREQ("", str_buffer);
    CfdFreeStringBuffer(str_buffer);
    str_buffer = nullptr;
  }

  ret = CfdFreeHandle(handle);
  EXPECT_EQ(kCfdSuccess, ret);
}